

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int array_container_to_uint32_array(void *vout,array_container_t *cont,uint32_t base)

{
  long lVar1;
  
  if (0 < cont->cardinality) {
    lVar1 = 0;
    do {
      *(uint *)((long)vout + lVar1 * 4) = cont->array[lVar1] + base;
      lVar1 = lVar1 + 1;
    } while (lVar1 < cont->cardinality);
    return (int)lVar1;
  }
  return 0;
}

Assistant:

int array_container_to_uint32_array(void *vout, const array_container_t *cont,
                                    uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    for (int i = 0; i < cont->cardinality; ++i) {
        const uint32_t val = base + cont->array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}